

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

void nghttp2_frame_unpack_priority_update_payload
               (nghttp2_extension *frame,uint8_t *payload,size_t payloadlen)

{
  uint *puVar1;
  uint32_t uVar2;
  nghttp2_ext_priority_update *priority_update;
  size_t payloadlen_local;
  uint8_t *payload_local;
  nghttp2_extension *frame_local;
  
  if (3 < payloadlen) {
    puVar1 = (uint *)frame->payload;
    uVar2 = nghttp2_get_uint32(payload);
    *puVar1 = uVar2 & 0x7fffffff;
    if (payloadlen < 5) {
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
    }
    else {
      *(uint8_t **)(puVar1 + 2) = payload + 4;
      *(size_t *)(puVar1 + 4) = payloadlen - 4;
    }
    return;
  }
  __assert_fail("payloadlen >= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x3ab,
                "void nghttp2_frame_unpack_priority_update_payload(nghttp2_extension *, uint8_t *, size_t)"
               );
}

Assistant:

void nghttp2_frame_unpack_priority_update_payload(nghttp2_extension *frame,
                                                  uint8_t *payload,
                                                  size_t payloadlen) {
  nghttp2_ext_priority_update *priority_update;

  assert(payloadlen >= 4);

  priority_update = frame->payload;

  priority_update->stream_id =
      nghttp2_get_uint32(payload) & NGHTTP2_STREAM_ID_MASK;

  if (payloadlen > 4) {
    priority_update->field_value = payload + 4;
    priority_update->field_value_len = payloadlen - 4;
  } else {
    priority_update->field_value = NULL;
    priority_update->field_value_len = 0;
  }
}